

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::PtexUtils::anon_unknown_1::reduceu<unsigned_short>
               (unsigned_short *src,int sstride,int uw,int vw,unsigned_short *dst,int dstride,
               int nchan)

{
  int iVar1;
  int iVar2;
  ushort *puVar3;
  ushort *puVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ushort *in_RDI;
  undefined2 *in_R8;
  int in_R9D;
  int in_stack_00000008;
  unsigned_short *pixend;
  unsigned_short *rowend;
  unsigned_short *end;
  int drowskip;
  int srowskip;
  int rowlen;
  undefined2 *local_20;
  ushort *local_8;
  
  iVar1 = in_EDX * in_stack_00000008;
  local_20 = in_R8;
  for (local_8 = in_RDI; local_8 != in_RDI + in_ECX * (in_ESI / 2);
      local_8 = local_8 + (in_ESI / 2 - iVar1)) {
    puVar3 = local_8 + iVar1;
    for (; local_8 != puVar3; local_8 = local_8 + in_stack_00000008) {
      puVar4 = local_8 + in_stack_00000008;
      for (; local_8 != puVar4; local_8 = local_8 + 1) {
        iVar2 = halve<int>((uint)*local_8 + (uint)local_8[in_stack_00000008]);
        *local_20 = (short)iVar2;
        local_20 = local_20 + 1;
      }
    }
    local_20 = local_20 + (in_R9D / 2 - iVar1 / 2);
  }
  return;
}

Assistant:

inline void reduceu(const T* src, int sstride, int uw, int vw,
                        T* dst, int dstride, int nchan)
    {
        sstride /= (int)sizeof(T);
        dstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int srowskip = sstride - rowlen;
        int drowskip = dstride - rowlen/2;
        for (const T* end = src + vw*sstride; src != end;
             src += srowskip, dst += drowskip)
            for (const T* rowend = src + rowlen; src != rowend; src += nchan)
                for (const T* pixend = src+nchan; src != pixend; src++)
                    *dst++ = T(halve(src[0] + src[nchan]));
    }